

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::AddBoundaryPair
          (Impl *this,bool invert_a,bool invert_b,bool invert_result,CrossingProcessor *cp)

{
  pointer *this_00;
  bool bVar1;
  OpType OVar2;
  undefined1 local_60 [8];
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> b_starts;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> a_starts;
  OpType type;
  CrossingProcessor *cp_local;
  bool invert_result_local;
  bool invert_b_local;
  bool invert_a_local;
  Impl *this_local;
  
  OVar2 = op_type(this->op_);
  if ((OVar2 == DIFFERENCE) || (OVar2 == SYMMETRIC_DIFFERENCE)) {
    bVar1 = AreRegionsIdentical(this);
    if (bVar1) {
      return true;
    }
  }
  else {
    is_boolean_output(this);
  }
  this_00 = &b_starts.
             super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::vector
            ((vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *)this_00)
  ;
  std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::vector
            ((vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *)local_60
            );
  bVar1 = GetChainStarts(this,0,invert_a,invert_b,invert_result,cp,
                         (vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                          *)this_00);
  if ((((bVar1) &&
       (bVar1 = GetChainStarts(this,1,invert_b,invert_a,invert_result,cp,
                               (vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                                *)local_60), bVar1)) &&
      (bVar1 = AddBoundary(this,0,invert_a,invert_b,invert_result,
                           (vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                            *)&b_starts.
                               super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,cp), bVar1)) &&
     (bVar1 = AddBoundary(this,1,invert_b,invert_a,invert_result,
                          (vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                           *)local_60,cp), bVar1)) {
    bVar1 = is_boolean_output(this);
    if (!bVar1) {
      CrossingProcessor::DoneBoundaryPair(cp);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::~vector
            ((vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *)local_60
            );
  std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::~vector
            ((vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *)
             &b_starts.
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::AddBoundaryPair(
    bool invert_a, bool invert_b, bool invert_result, CrossingProcessor* cp) {
  // Optimization: if the operation is DIFFERENCE or SYMMETRIC_DIFFERENCE,
  // it is worthwhile checking whether the two regions are identical (in which
  // case the output is empty).
  //
  // TODO(ericv): When boolean output is requested there are other quick
  // checks that could be done here, such as checking whether a full cell from
  // one S2ShapeIndex intersects a non-empty cell of the other S2ShapeIndex.
  auto type = op_->op_type();
  if (type == OpType::DIFFERENCE || type == OpType::SYMMETRIC_DIFFERENCE) {
    if (AreRegionsIdentical()) return true;
  } else if (!is_boolean_output()) {
  }
  vector<ShapeEdgeId> a_starts, b_starts;
  if (!GetChainStarts(0, invert_a, invert_b, invert_result, cp, &a_starts) ||
      !GetChainStarts(1, invert_b, invert_a, invert_result, cp, &b_starts) ||
      !AddBoundary(0, invert_a, invert_b, invert_result, a_starts, cp) ||
      !AddBoundary(1, invert_b, invert_a, invert_result, b_starts, cp)) {
    return false;
  }
  if (!is_boolean_output()) cp->DoneBoundaryPair();
  return true;
}